

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_63917::data<float>::setUpFrameBuffer
          (data<float> *this,vector<float,_std::allocator<float>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  PixelType t;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  long lVar5;
  size_type sVar6;
  size_type sVar7;
  int *in_RCX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  byte in_R8B;
  size_t i;
  Slice *in_stack_00000190;
  char *in_stack_00000198;
  FrameBuffer *in_stack_000001a0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff08;
  int iVar8;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar9;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff10;
  int local_88;
  int local_80;
  Slice local_78;
  ulong local_40;
  byte local_21;
  int *local_20;
  vector<float,_std::allocator<float>_> *local_10;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(in_RDI);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffff10,CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
            );
  local_40 = 0;
  do {
    uVar1 = local_40;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar3 <= uVar1) {
      return;
    }
    if ((local_21 & 1) == 0) {
LAB_00140ed9:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,local_40);
      std::__cxx11::string::c_str();
      t = *(PixelType *)
           &in_RDI[6].
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](local_10,local_40);
      iVar9 = *local_20;
      iVar8 = local_20[1];
      Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
                ((Box<Imath_2_5::Vec2<int>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      lVar5 = (long)(iVar9 + iVar8 * (local_80 + 1));
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI);
      Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size
                ((Box<Imath_2_5::Vec2<int>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RDI);
      in_stack_fffffffffffffee8 = 1;
      in_stack_fffffffffffffef0 = 0;
      in_stack_fffffffffffffef8 = 0;
      Imf_2_5::Slice::Slice
                (&local_78,t,(char *)(pvVar4 + -(lVar5 * sVar3)),sVar6 << 2,
                 (long)(local_88 + 1) * 4 * sVar7,1,1,0.0,false,false);
      Imf_2_5::FrameBuffer::insert(in_stack_000001a0,in_stack_00000198,in_stack_00000190);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_RDI,local_40);
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
      ;
      if (bVar2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](in_RDI,local_40);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                ));
        if (bVar2) goto LAB_00140ed9;
      }
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void 
    setUpFrameBuffer(vector<T> & data,FrameBuffer & framebuf,const Box2i & dw,bool dontbotherloadingdepth) const
    {
        
        // allocate enough space for all channels (even the depth channel)
        data.resize(_channels.size()*(dw.size().x+1)*(dw.size().y+1));
        for(size_t i=0;i<_channels.size();i++)
        {
            if(!dontbotherloadingdepth || (_channels[i]!="Z" && _channels[i]!="ZBack") )
            {
                framebuf.insert(_channels[i].c_str(),
                                Slice(_type,(char *) (&data[i] - (dw.min.x + dw.min.y*(dw.size().x+1))*_channels.size() ),
                                      sizeof(T)*_channels.size(),
                                      sizeof(T)*(dw.size().x+1)*_channels.size())
                                      );
            }
        }
    }